

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::BasicMS<tcu::Vector<int,_4>,_2>::Run(BasicMS<tcu::Vector<int,_4>,_2> *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint level;
  GLuint texture;
  GLuint unit;
  int required;
  GLboolean layered;
  int i;
  long lVar2;
  GLenum *pGVar3;
  GLenum GVar4;
  ImageSizeMachine machine;
  ivec4 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Vector<int,_4> local_68;
  Vector<int,_4> local_58;
  Vector<int,_4> local_48;
  
  required = 2;
  bVar1 = ShaderImageSizeBase::SupportedInStage(&this->super_ShaderImageSizeBase,2,5);
  lVar2 = 0x10;
  if (bVar1) {
    bVar1 = ShaderImageSizeBase::SupportedSamples(&this->super_ShaderImageSizeBase,required);
    if (bVar1) {
      this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                 super_CallLogWrapper;
      pGVar3 = &DAT_016e8590;
      for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
        GVar4 = *pGVar3;
        glu::CallLogWrapper::glBindTexture(this_00,GVar4,this->m_texture[lVar2]);
        if ((uint)lVar2 < 2) {
          glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2801,0x2600);
          glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2800,0x2600);
          unit = 1;
          if (lVar2 == 0) {
            glu::CallLogWrapper::glTexStorage1D(this_00,GVar4,10,0x8d82,0x200);
            texture = this->m_texture[0];
            level = 6;
            layered = '\0';
          }
          else {
            glu::CallLogWrapper::glTexStorage2D(this_00,GVar4,3,0x8d82,0xf,7);
            texture = this->m_texture[lVar2];
            level = unit;
            unit = 2;
LAB_00a927d4:
            layered = '\x01';
          }
          GVar4 = 35000;
        }
        else {
          if ((uint)lVar2 != 2) {
            unit = 4;
            glu::CallLogWrapper::glTexImage3DMultisample(this_00,GVar4,4,0x8d82,0x40,0x20,5,'\0');
            texture = this->m_texture[lVar2];
            level = 0;
            goto LAB_00a927d4;
          }
          glu::CallLogWrapper::glTexImage2DMultisample(this_00,GVar4,4,0x8d82,0x11,0x13,'\0');
          texture = this->m_texture[lVar2];
          unit = 3;
          level = 0;
          layered = '\0';
          GVar4 = 0x88ba;
        }
        glu::CallLogWrapper::glBindImageTexture(this_00,unit,texture,level,layered,0,GVar4,0x8d82);
        pGVar3 = pGVar3 + 1;
      }
      ImageSizeMachine::ImageSizeMachine(&machine);
      local_a8.m_data[0] = 8;
      local_a8.m_data[1] = 0;
      local_a8.m_data[2] = 0;
      local_a8.m_data[3] = 0;
      local_98 = 0x700000007;
      uStack_90 = 0;
      local_88 = 0x1300000011;
      uStack_80 = 0;
      local_78 = 0x2000000040;
      uStack_70 = 5;
      tcu::Vector<int,_4>::Vector(&local_68,0);
      tcu::Vector<int,_4>::Vector(&local_58,0);
      tcu::Vector<int,_4>::Vector(&local_48,0);
      lVar2 = gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<int,4>>
                        ((ImageSizeMachine *)&machine,2,true,&local_a8,false);
      ImageSizeMachine::~ImageSizeMachine(&machine);
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 5))
			return NOT_SUPPORTED;
		if (!SupportedSamples(4))
			return NOT_SUPPORTED;

		const GLenum target[4] = { GL_TEXTURE_1D, GL_TEXTURE_1D_ARRAY, GL_TEXTURE_2D_MULTISAMPLE,
								   GL_TEXTURE_2D_MULTISAMPLE_ARRAY };
		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] == GL_TEXTURE_1D || target[i] == GL_TEXTURE_1D_ARRAY)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexStorage1D(target[i], 10, TexInternalFormat<T>(), 512);
				glBindImageTexture(1, m_texture[i], 6, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage2D(target[i], 3, TexInternalFormat<T>(), 15, 7);
				glBindImageTexture(2, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexImage2DMultisample(target[i], 4, TexInternalFormat<T>(), 17, 19, GL_FALSE);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexImage3DMultisample(target[i], 4, TexInternalFormat<T>(), 64, 32, 5, GL_FALSE);
				glBindImageTexture(4, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4 res[7] = { ivec4(8, 0, 0, 0), ivec4(7, 7, 0, 0), ivec4(17, 19, 0, 0), ivec4(64, 32, 5, 0), ivec4(0),
						 ivec4(0),			ivec4(0) };
		return machine.Run<T>(STAGE, true, res);
	}